

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fak_algorithm.c
# Opt level: O0

void fak_c(void)

{
  int iVar1;
  int *piVar2;
  int joint_type;
  kcc_joint *joint;
  int local_148;
  int i;
  solver_state_c s;
  kcc_kinematic_chain *kc;
  
  s.tau_ctrl = (joint_torque *)&two_dof_robot_c;
  setup_simple_state_c(&two_dof_robot_c,&local_148);
  (s.xdd)->angular_acceleration = (vector3 *)0x3ff0000000000000;
  (s.xdd)->linear_acceleration = (vector3 *)0x3ff0000000000000;
  *s.q = 1.0;
  s.q[1] = 1.0;
  *s.qd = 1.0;
  s.qd[1] = 1.0;
  for (joint._4_4_ = 1; joint._4_4_ < local_148 + 1; joint._4_4_ = joint._4_4_ + 1) {
    piVar2 = (int *)((long)s.tau_ctrl[1] + (long)(joint._4_4_ + -1) * 0x90 + 0x10);
    iVar1 = *piVar2;
    (**(code **)(&kcc_joint + (long)iVar1 * 0x40))
              (piVar2,&(s.xdd)->angular_acceleration + (joint._4_4_ + -1),
               s._8_8_ + (long)(joint._4_4_ + -1) * 0x10);
    gc_pose_compose(s._8_8_ + (long)(joint._4_4_ + -1) * 0x10,
                    (long)s.tau_ctrl[1] + (long)(joint._4_4_ + -1) * 0x90,
                    s.x_jnt + (joint._4_4_ + -1));
    (**(code **)(gc_acc_twist_tf_ref_to_tgt + (long)iVar1 * 0x40))
              (piVar2,s.q + (joint._4_4_ + -1),s.x_tot + (joint._4_4_ + -1));
    gc_twist_tf_ref_to_tgt
              (s.x_jnt + (joint._4_4_ + -1),s.xd_tf + (joint._4_4_ + -1),
               s.xd_jnt + (joint._4_4_ + -1));
    gc_twist_accumulate(s.xd_jnt + (joint._4_4_ + -1),s.x_tot + (joint._4_4_ + -1),
                        s.xd_tf + joint._4_4_);
    (**(code **)(&two_dof_robot_a + (long)iVar1 * 0x40))
              (piVar2,s.qd + (joint._4_4_ + -1),s.xd + (joint._4_4_ + -1));
    (**(code **)(&two_dof_robot_c + (long)iVar1 * 0x40))
              (piVar2,s.xd_tf + joint._4_4_,s.q + (joint._4_4_ + -1),s.xdd_jnt + (joint._4_4_ + -1))
    ;
    gc_acc_twist_add(s.xd + (joint._4_4_ + -1),s.xdd_jnt + (joint._4_4_ + -1),
                     s.xdd_bias + (joint._4_4_ + -1));
    gc_acc_twist_tf_ref_to_tgt
              (s.x_jnt + (joint._4_4_ + -1),s.xdd_nact + (joint._4_4_ + -1),
               s.xdd_net + (joint._4_4_ + -1));
    gc_acc_twist_accumulate
              (s.xdd_net + (joint._4_4_ + -1),s.xdd_bias + (joint._4_4_ + -1),
               s.xdd_nact + joint._4_4_);
  }
  gc_acc_twist_log(s.xdd_nact + local_148);
  return;
}

Assistant:

void fak_c()
{
    struct kcc_kinematic_chain *kc = &two_dof_robot_c;
    struct solver_state_c s;

    setup_simple_state_c(kc, &s);

    s.q[0] = 1.0;
    s.q[1] = 1.0;
    s.qd[0] = 1.0;
    s.qd[1] = 1.0;
    s.qdd[0] = 1.0;
    s.qdd[1] = 1.0;


    for (int i = 1; i < s.nbody + 1; i++) {
        struct kcc_joint *joint = &kc->segment[i - 1].joint;
        int joint_type = joint->type;

        // Position
        //

        // X_{J,i}
        kcc_joint[joint_type].fpk(joint, &s.q[i - 1], &s.x_jnt[i - 1]);

        // i^X_{i-1} = X_{J,i} X_{T,i}
        gc_pose_compose(&s.x_jnt[i - 1], &kc->segment[i - 1].joint_attachment, &s.x_rel[i - 1]);


        // Velocity
        //

        // Xd_{J,i} = S qd
        kcc_joint[joint_type].fvk(joint, &s.qd[i - 1], &s.xd_jnt[i - 1]);

        // Xd_{i-1}' = i^X_{i-1} Xd_{i-1}
        gc_twist_tf_ref_to_tgt(&s.x_rel[i - 1], &s.xd[i - 1], &s.xd_tf[i - 1]);

        // Xd_i = Xd_{i-1}' + Xd_{J,i}
        gc_twist_accumulate(&s.xd_tf[i - 1], &s.xd_jnt[i - 1], &s.xd[i]);


        // Acceleration
        //

        // Xdd_{J,i} = S_i qdd_i
        kcc_joint[joint_type].fak(joint, &s.qdd[i - 1], &s.xdd_jnt[i - 1]);

        // Xdd_{bias,i} = S_i qdd_i + Sd_i qd_i + Xd_i x S_i qd_i
        kcc_joint[joint_type].inertial_acceleration(joint, &s.xd[i], &s.qd[i - 1], &s.xdd_bias[i - 1]);

        // Xdd_{J,i}' = Xdd_{J,i} + Xdd_{bias,i}
        gc_acc_twist_add(&s.xdd_jnt[i - 1], &s.xdd_bias[i - 1], &s.xdd_net[i - 1]);

        // Xdd_{i-1}' = i^X_{i-1} Xdd_{i-1}
        gc_acc_twist_tf_ref_to_tgt(&s.x_rel[i - 1], &s.xdd[i - 1], &s.xdd_tf[i - 1]);

        // Xdd_i = Xdd_{i-1}' + Xdd_{J,i}'
        gc_acc_twist_accumulate(&s.xdd_tf[i - 1], &s.xdd_net[i - 1], &s.xdd[i]);
    }

    gc_acc_twist_log(&s.xdd[s.nbody]);
}